

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro_expander.cpp
# Opt level: O3

bool __thiscall
skiwi::anon_unknown_26::macro_expander_visitor::_previsit
          (macro_expander_visitor *this,Expression *e)

{
  int iVar1;
  int iVar2;
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  *__v;
  macro_data *this_00;
  macro_expander_visitor *pmVar3;
  variant_alternative_t<5UL,_variant<Begin,_Case,_Cond,_Do,_ForeignCall,_FunCall,_If,_Lambda,_Let,_variant<Character,_False,_Fixnum,_Flonum,_Nil,_String,_Symbol,_True>,_Nop,_PrimitiveCall,_Quote,_Set,_Variable>_>
  *pvVar4;
  variant_alternative_t<14UL,_variant<Begin,_Case,_Cond,_Do,_ForeignCall,_FunCall,_If,_Lambda,_Let,_variant<Character,_False,_Fixnum,_Flonum,_Nil,_String,_Symbol,_True>,_Nop,_PrimitiveCall,_Quote,_Set,_Variable>_>
  *pvVar5;
  iterator iVar6;
  code *pcVar7;
  uint64_t rax;
  ulong uVar8;
  ulong uVar9;
  _Alloc_hider _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
  *pvVar12;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> local_e30;
  variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
  *local_e20;
  macro_expander_visitor *local_e18;
  variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
  *local_e10;
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens_1;
  uint64_t fie_size;
  string script;
  first_pass_data d;
  string local_d58;
  string local_d38;
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
  local_d00;
  Program pr;
  asmcode code;
  stringstream str_1;
  int iStack_c1c;
  uint64_t local_c10 [2];
  _Alloc_hider local_c00;
  _Alloc_hider local_bf8;
  undefined1 local_bf0 [24];
  vector<skiwi::cell,_std::allocator<skiwi::cell>_> local_bd8;
  vector<skiwi::cell,_std::allocator<skiwi::cell>_> local_bc0;
  quote_type local_ba8;
  _Alloc_hider local_ba0;
  size_type local_b98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b90 [15];
  undefined1 local_a98 [40];
  size_type local_a70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a68;
  size_type local_a58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a50;
  macro_data md;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>_>_>
  externals;
  runtime_error er;
  ostream local_9b8 [112];
  ios_base local_948 [104];
  __index_type local_8e0;
  
  if ((e->
      super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      ).
      super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      ._M_index != '\x05') {
    return true;
  }
  pvVar4 = std::
           get<5ul,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                     (e);
  __v = (pvVar4->fun).
        super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if ((__v->
      super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      ).
      super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      ._M_index != '\x0e') {
    return true;
  }
  this_00 = this->p_md;
  pvVar5 = std::
           get<14ul,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                     (__v);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>_>_>
                  *)this_00,&pvVar5->name);
  if ((_Rb_tree_header *)iVar6._M_node == &(this->p_md->m)._M_t._M_impl.super__Rb_tree_header) {
    return true;
  }
  uVar8 = (long)iVar6._M_node[3]._M_parent - *(long *)(iVar6._M_node + 3) >> 5;
  uVar9 = ((long)(pvVar4->arguments).
                 super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar4->arguments).
                 super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x1111111111111111;
  local_e20 = (variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
               *)e;
  if (*(char *)&iVar6._M_node[3]._M_right == '\0') {
    if (uVar8 == uVar9) goto LAB_001f4d5b;
    iVar1 = pvVar4->line_nr;
    iVar2 = pvVar4->column_nr;
    paVar11 = &local_d38.field_2;
    local_d38._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d38,*(long *)(iVar6._M_node + 1),
               (long)&(iVar6._M_node[1]._M_parent)->_M_color + *(long *)(iVar6._M_node + 1));
    throw_error(iVar1,iVar2,&pvVar4->filename,macro_invalid_pattern,&local_d38);
    _Var10._M_p = local_d38._M_dataplus._M_p;
  }
  else {
    if (uVar8 <= uVar9 + 1) goto LAB_001f4d5b;
    iVar1 = pvVar4->line_nr;
    iVar2 = pvVar4->column_nr;
    paVar11 = &local_d58.field_2;
    local_d58._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d58,*(long *)(iVar6._M_node + 1),
               (long)&(iVar6._M_node[1]._M_parent)->_M_color + *(long *)(iVar6._M_node + 1));
    throw_error(iVar1,iVar2,&pvVar4->filename,macro_invalid_pattern,&local_d58);
    _Var10._M_p = local_d58._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != paVar11) {
    operator_delete(_Var10._M_p,paVar11->_M_allocated_capacity + 1);
  }
LAB_001f4d5b:
  this->macros_expanded = true;
  pvVar12 = (variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
             *)(pvVar4->arguments).
               super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_e10 = (variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
               *)(pvVar4->arguments).
                 super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  local_e18 = this;
  if (pvVar12 != local_e10) {
    do {
      _str_1 = -1;
      iStack_c1c = -1;
      local_c10[0] = 0;
      local_c10[1] = 0;
      cell::cell((cell *)&local_c00);
      local_ba8 = qt_quote;
      local_ba0._M_p = (pointer)local_b90;
      local_b98 = 0;
      local_b90[0]._M_local_buf[0] = '\0';
      std::__cxx11::stringstream::stringstream((stringstream *)&er);
      dump(local_9b8,(Expression *)pvVar12,false);
      std::__cxx11::stringbuf::str();
      tokenize(&tokens,(string *)&pr);
      if (pr.expressions.
          super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&pr.expressions.
                    super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(pr.expressions.
                        super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((pr.expressions.
                                         super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                       ).
                                       super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                       .
                                       super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                       .
                                       super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                       .
                                       super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                       .
                                       super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                                       ._M_u + 1));
      }
      std::
      __reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
                (tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      read_from((cell *)&d,&tokens,true);
      std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector(&tokens);
      std::__cxx11::stringstream::~stringstream((stringstream *)&er);
      std::ios_base::~ios_base(local_948);
      local_c00._M_p._0_4_ = (undefined4)d.size;
      std::__cxx11::string::operator=((string *)&local_bf8,(string *)&d.data_size);
      local_9b8._0_8_ =
           local_bd8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      _er = local_bd8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
            super__Vector_impl_data._M_start;
      local_bd8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_bd8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_bd8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::~vector
                ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)&er);
      local_9b8._0_8_ =
           local_bc0.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      _er = local_bc0.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
            super__Vector_impl_data._M_start;
      local_bc0.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_bc0.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)d.external_to_address._M_t._M_impl._0_8_;
      local_bc0.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      d.external_to_address._M_t._M_impl._0_8_ = 0;
      d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::~vector
                ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)&er);
      std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::~vector
                ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)&d.external_to_address);
      std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::~vector
                ((vector<skiwi::cell,_std::allocator<skiwi::cell>_> *)
                 &d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
      if ((_Rb_tree_header *)d.data_size != &d.label_to_address._M_t._M_impl.super__Rb_tree_header)
      {
        operator_delete((void *)d.data_size,
                        CONCAT44(d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _4_4_,d.label_to_address._M_t._M_impl.super__Rb_tree_header.
                                       _M_header._M_color) + 1);
      }
      std::
      variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
      ::operator=(pvVar12,(Quote *)&str_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ba0._M_p != local_b90) {
        operator_delete(local_ba0._M_p,
                        CONCAT71(local_b90[0]._M_allocated_capacity._1_7_,
                                 local_b90[0]._M_local_buf[0]) + 1);
      }
      std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::~vector(&local_bc0);
      std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::~vector(&local_bd8);
      if (local_bf8._M_p != local_bf0 + 8) {
        operator_delete(local_bf8._M_p,local_bf0._8_8_ + 1);
      }
      pvVar12 = pvVar12 + 0xf0;
    } while (pvVar12 != local_e10);
  }
  pr.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pr.quotes._M_t._M_impl.super__Rb_tree_header._M_header;
  pr.expressions.
  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pr.expressions.
  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pr.expressions.
  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pr.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pr.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pr.quotes._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ = 0;
  pr.quotes._M_t._M_impl.super__Rb_tree_header._M_node_count._6_2_ = 0;
  pr.alpha_converted = false;
  pr.assignable_variables_converted = false;
  pr.define_converted = false;
  pr.closure_converted = false;
  pr.cps_converted = false;
  pr.free_variables_analysed = false;
  pr.linear_scan_indices_computed = false;
  pr.lambda_to_let_converted = false;
  pr.include_handled = false;
  pr.simplified_to_core_forms = false;
  pr.single_begin_conversion = false;
  pr.tail_call_analysis = false;
  pr.global_define_env_allocated = false;
  pr.quotes_collected = false;
  pr.quotes_converted = false;
  pr.quasiquotes_converted = false;
  pr.inline_primitives_converted = false;
  pr.constant_folded = false;
  pr.constant_propagated = false;
  pr.macros_expanded = false;
  pr.single_begins_removed = false;
  pr.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pr.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__detail::__variant::_Uninitialized<skiwi::FunCall,false>::_Uninitialized<skiwi::FunCall&>
            ((_Uninitialized<skiwi::FunCall,false> *)&er,pvVar4);
  local_8e0 = '\x05';
  std::
  vector<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>,std::allocator<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>>>
  ::
  emplace_back<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>>
            ((vector<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>,std::allocator<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>>>
              *)&pr,(variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     *)&er);
  pmVar3 = local_e18;
  std::__detail::__variant::
  _Variant_storage<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  ::~_Variant_storage((_Variant_storage<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                       *)&er);
  externals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &externals._M_t._M_impl.super__Rb_tree_header._M_header;
  externals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  externals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  externals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  externals._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       externals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_system_calls(&externals);
  pvVar12 = local_e20;
  assembler::asmcode::asmcode(&code);
  assembler::registers::registers((registers *)&er);
  md.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &md.m._M_t._M_impl.super__Rb_tree_header._M_header;
  md.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  md.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  md.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  md.compiled_macros.
  super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  md.compiled_macros.
  super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  md.compiled_macros.
  super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       md.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  compile(pmVar3->p_env,pmVar3->p_rd,&md,pmVar3->p_ctxt,&code,&pr,pmVar3->p_pm,&externals,
          &pmVar3->ops);
  d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header;
  d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  d.size = 0;
  d.data_size = 0;
  d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header;
  d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
  ;
  d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar7 = (code *)assembler::assemble(&fie_size,&d,&code);
  if (pcVar7 == (code *)0x0) {
    _str_1 = -1;
    iStack_c1c = -1;
    local_c10[0] = 0;
    local_c10[1] = 0;
    local_bf8._M_p = (pointer)0x0;
    local_bf0[0] = '\0';
    local_c00._M_p = local_bf0;
    std::
    variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
    ::operator=(pvVar12,(Nop *)&str_1);
    if (local_c00._M_p != local_bf0) {
      operator_delete(local_c00._M_p,CONCAT71(local_bf0._1_7_,local_bf0[0]) + 1);
    }
  }
  else {
    rax = (*pcVar7)(pmVar3->p_ctxt);
    std::__cxx11::stringstream::stringstream((stringstream *)&str_1);
    local_e30.
    super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (pmVar3->p_env->
             super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    local_e30.
    super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (pmVar3->p_env->
         super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
         )._M_refcount._M_pi;
    if (local_e30.
        super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e30.
         super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_e30.
              super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e30.
         super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_e30.
              super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    scheme_runtime(rax,(ostream *)local_c10,&local_e30,pmVar3->p_rd,pmVar3->p_ctxt);
    if (local_e30.
        super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e30.
                 super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::__cxx11::stringbuf::str();
    tokenize(&tokens_1,&script);
    std::
    __reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
              (tokens_1.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
               super__Vector_impl_data._M_start,
               tokens_1.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
               super__Vector_impl_data._M_finish);
    make_program((Program *)&tokens,&tokens_1);
    if (tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
        super__Vector_impl_data._M_start ==
        tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_a98._0_8_ =
           (variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
            *)0xffffffffffffffff;
      local_a98._8_8_ = local_a98._8_8_ & 0xffffffffffffff00;
      local_a98._16_8_ = (pointer)0x0;
      local_a98._24_8_ = (pointer)0x0;
      local_a70 = 0;
      aStack_a68._M_allocated_capacity = aStack_a68._M_allocated_capacity & 0xffffffffffffff00;
      local_a98._32_8_ = &aStack_a68;
      std::
      variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
      ::operator=(pvVar12,(Nop *)local_a98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a98._32_8_ != &aStack_a68) {
        operator_delete((void *)local_a98._32_8_,aStack_a68._M_allocated_capacity + 1);
      }
    }
    else if ((long)tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
                   super__Vector_impl_data._M_start == 0xf0) {
      local_a98._0_8_ = pvVar12;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_&>
        ::_S_vtable._M_arr
        [(long)(char)tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
                     super__Vector_impl_data._M_start[4].line_nr + 1]._M_data)
                ((anon_class_8_1_8991fb9c *)local_a98,
                 (variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                  *)tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
                    super__Vector_impl_data._M_start);
    }
    else {
      aStack_a68._8_8_ = &local_a50;
      local_a98._0_8_ =
           (variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
            *)0xffffffffffffffff;
      local_a98._32_8_ = local_a98._32_8_ & 0xffffffffffffff00;
      local_a70 = 0;
      aStack_a68._M_allocated_capacity = 0;
      local_a58 = 0;
      local_a50._M_local_buf[0] = '\0';
      local_a98._8_8_ =
           tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_a98._16_8_ =
           tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_a98._24_8_ =
           tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
      ::operator=(pvVar12,(Begin *)local_a98);
      Begin::~Begin((Begin *)local_a98);
    }
    assembler::free_assembled_function(pcVar7,fie_size);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
    ::~_Rb_tree(&local_d00);
    std::
    vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
    ::~vector((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
               *)&tokens);
    std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector(&tokens_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)script._M_dataplus._M_p != &script.field_2) {
      operator_delete(script._M_dataplus._M_p,script.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&str_1);
    std::ios_base::~ios_base((ios_base *)&local_ba0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&d.external_to_address._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&d.label_to_address._M_t);
  if (md.compiled_macros.
      super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(md.compiled_macros.
                    super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)md.compiled_macros.
                          super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)md.compiled_macros.
                          super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>_>_>
               *)&md);
  assembler::asmcode::~asmcode(&code);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>_>_>
  ::~_Rb_tree(&externals._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
  ::~_Rb_tree(&pr.quotes._M_t);
  std::
  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ::~vector(&pr.expressions);
  return false;
}

Assistant:

virtual bool _previsit(Expression& e)
      {
      if (std::holds_alternative<FunCall>(e))
        {
        auto& f = std::get<FunCall>(e);
        if (std::holds_alternative<Variable>(f.fun.front()))
          {
          auto it = p_md->m.find(std::get<Variable>(f.fun.front()).name);
          if (it != p_md->m.end())
            {
            if (!it->second.variable_arity)
              {
              if (it->second.variables.size() != f.arguments.size())
                throw_error(f.line_nr, f.column_nr, f.filename, macro_invalid_pattern, it->first);
              }
            else
              {
              if (it->second.variables.size() > f.arguments.size()+1)
                throw_error(f.line_nr, f.column_nr, f.filename, macro_invalid_pattern, it->first);
              }
            macros_expanded = true;
            for (auto& arg : f.arguments)
              {
              Quote q;
              q.arg = expression_to_cell(arg);
              arg = q;
              }
            Program pr;
            pr.expressions.push_back(f);
            std::map<std::string, external_function> externals;
                add_system_calls(externals);
            asmcode code;
            try
              {
                  registers reg;
              macro_data md; // all macros are in the environment
#ifdef _SKIWI_FOR_ARM
              compile(*p_env, *p_rd, md, *p_ctxt, code, pr, *p_pm, externals, ops);
              auto externals_for_vm = convert_externals_to_vm(externals);
                  first_pass_data d;
                  uint64_t fie_size;
                  uint8_t* fie = (uint8_t*)vm_bytecode(fie_size, d, code);
                  if (fie)
                  {
#ifdef _WIN32
        reg.rcx = (uint64_t)(p_ctxt);
#else
        reg.rdi = (uint64_t)(p_ctxt);
#endif
              run_bytecode(fie, fie_size, reg, externals_for_vm);
                      uint64_t res = reg.rax;
                      std::stringstream str;
                      scheme_runtime(res, str, *p_env, *p_rd, p_ctxt);
                      std::string script = str.str();
                      //printf("%s\n", script.c_str());
                      auto tokens = tokenize(script);
                      std::reverse(tokens.begin(), tokens.end());
                      auto result = make_program(tokens);

                      if (result.expressions.empty())
                        e = Nop();
                      else if (result.expressions.size() == 1)
                        e = result.expressions.front();
                      else
                        {
                        Begin b;
                        b.arguments.swap(result.expressions);
                        e = b;
                        }
                      free_bytecode((void*)fie, fie_size);
                  }
                  else
                    e = Nop();
                  
#else
              compile(*p_env, *p_rd, md, *p_ctxt, code, pr, *p_pm, externals, ops);
              typedef uint64_t(*compiled_fun_ptr)(void*);

              first_pass_data d;
              uint64_t fie_size;
              compiled_fun_ptr fie = (compiled_fun_ptr)assemble(fie_size, d, code);

              if (fie)
                {
                auto res = fie(p_ctxt);
                std::stringstream str;
                scheme_runtime(res, str, *p_env, *p_rd, p_ctxt);
                std::string script = str.str();
                //printf("%s\n", script.c_str());
                auto tokens = tokenize(script);
                std::reverse(tokens.begin(), tokens.end());
                auto result = make_program(tokens);

                if (result.expressions.empty())
                  e = Nop();
                else if (result.expressions.size() == 1)
                  e = result.expressions.front();
                else
                  {
                  Begin b;
                  b.arguments.swap(result.expressions);
                  e = b;
                  }

                free_assembled_function((void*)fie, fie_size);
                }
              else
                e = Nop();
#endif
              }
            catch (std::logic_error er)
              {
              std::cout << er.what() << "\n";
              throw er;
              }
            catch (std::runtime_error er)
              {
              std::cout << er.what() << "\n";
              throw er;
              }

            return false;
            }
          }
        }
      return true;
      }